

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  CleanupNode *pCVar2;
  CleanupNode *pCVar3;
  char *elem;
  char *failure_msg;
  __pointer_type pAVar4;
  void *pvVar5;
  CleanupNode *pCVar6;
  __pointer_type pAVar7;
  int line;
  CleanupNode *pCVar8;
  size_t n_00;
  ulong n_01;
  LogMessageFatal local_40;
  
  if (align < 9) {
    n_00 = n + 7 & 0xfffffffffffffff8;
    n_01 = n_00;
  }
  else {
    local_40.super_LogMessage._0_8_ = ArenaAlignAs(align);
    n_00 = ArenaAlign::Padded((ArenaAlign *)&local_40,n);
    n_01 = n + 7 & 0xfffffffffffffff8;
  }
  AllocateNewBlock(this,n_00);
  local_40.super_LogMessage._0_8_ = ArenaAlignAs(align);
  elem = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&local_40,(this->ptr_)._M_b._M_p);
  pAVar1 = (__pointer_type)(elem + n_01);
  if ((__pointer_type)this->limit_ < pAVar1) {
    pvVar5 = AllocateAlignedWithCleanupFallback(this,n_01,align,destructor);
    return pvVar5;
  }
  (this->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar2 = (this->cleanup_list_).next_;
  if (pCVar2 < (this->cleanup_list_).limit_) {
    (this->cleanup_list_).next_ = pCVar2 + 1;
    pCVar2->elem = elem;
    pCVar2->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this->cleanup_list_,elem,destructor,this);
  }
  pCVar2 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
  if ((pCVar2 != (CleanupNode *)0x0) && (pCVar2 < (CleanupNode *)(this->cleanup_list_).head_)) {
    failure_msg = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    line = 0x136;
    goto LAB_001b7465;
  }
  pCVar3 = (this->cleanup_list_).next_;
  pCVar6 = pCVar2;
  if (((long)pCVar2 - (long)pCVar3 < 0x181) &&
     (pCVar8 = (this->cleanup_list_).limit_, pCVar2 < pCVar8)) {
    pCVar6 = pCVar3;
    if (pCVar3 < pCVar2) {
      pCVar6 = pCVar2;
    }
    if (pCVar6 != (CleanupNode *)0x0) {
      if (pCVar6 + 0x18 < pCVar8) {
        pCVar8 = pCVar6 + 0x18;
      }
      for (; pCVar6 < pCVar8; pCVar6 = pCVar6 + 4) {
      }
      goto LAB_001b7315;
    }
  }
  else {
LAB_001b7315:
    (this->cleanup_list_).prefetch_ptr_ = (char *)pCVar6;
    local_40.super_LogMessage._0_8_ = (this->ptr_)._M_b._M_p;
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                            (&this->limit_,(char **)&local_40,"limit_ >= ptr()");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      line = 0xf2;
      goto LAB_001b7465;
    }
    pAVar4 = (__pointer_type)this->prefetch_ptr_;
    if ((pAVar4 != (__pointer_type)0x0) && (pAVar4 < (this->head_)._M_b._M_p)) {
      failure_msg = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      line = 0x12d;
      goto LAB_001b7465;
    }
    if ((0x400 < (long)pAVar4 - (long)pAVar1) ||
       (pAVar7 = (__pointer_type)this->limit_, pAVar7 <= pAVar4)) {
LAB_001b7369:
      this->prefetch_ptr_ = (char *)pAVar4;
      return elem;
    }
    if (pAVar1 < pAVar4) {
      pAVar1 = pAVar4;
    }
    pAVar4 = pAVar1;
    if (pAVar4 != (__pointer_type)0x0) {
      if (pAVar4 + 0x40 < pAVar7) {
        pAVar7 = pAVar4 + 0x40;
      }
      for (; pAVar4 < pAVar7; pAVar4 = pAVar4 + 4) {
      }
      goto LAB_001b7369;
    }
  }
  failure_msg = "prefetch_ptr != nullptr";
  line = 0x122;
LAB_001b7465:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}